

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumValueDescriptorProto::InternalSwap
          (EnumValueDescriptorProto *this,EnumValueDescriptorProto *other)

{
  InternalMetadataWithArena *this_00;
  uint32 uVar1;
  int32 iVar2;
  void *pvVar3;
  string *psVar4;
  EnumValueOptions *pEVar5;
  UnknownFieldSet *other_00;
  
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar3 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      other_00 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ::mutable_unknown_fields_slow
                           (&this_00->
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           );
    }
    else {
      other_00 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  psVar4 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar4;
  pEVar5 = this->options_;
  this->options_ = other->options_;
  other->options_ = pEVar5;
  iVar2 = this->number_;
  this->number_ = other->number_;
  other->number_ = iVar2;
  return;
}

Assistant:

void EnumValueDescriptorProto::InternalSwap(EnumValueDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
  swap(number_, other->number_);
}